

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void __thiscall QIconModeViewBase::updateContentsSize(QIconModeViewBase *this)

{
  Representation RVar1;
  Representation RVar2;
  QListViewItem *pQVar3;
  QSize QVar4;
  int extraout_EDX;
  int extraout_var;
  long lVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QRect local_58;
  QRect local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  local_48.x2.m_i = -1;
  local_48.y2.m_i = -1;
  if ((this->items).d.size != 0) {
    lVar5 = 10;
    uVar6 = 0;
    do {
      pQVar3 = (this->items).d.ptr;
      RVar1.m_i = *(int *)((long)pQVar3 + lVar5 + -10);
      RVar2.m_i = *(int *)((long)pQVar3 + lVar5 + -6);
      local_58.x2.m_i = *(short *)((long)pQVar3 + lVar5 + -2) + RVar1.m_i + -1;
      local_58.y1.m_i = RVar2.m_i;
      local_58.x1.m_i = RVar1.m_i;
      local_58.y2.m_i = *(short *)((long)&pQVar3->x + lVar5) + RVar2.m_i + -1;
      local_48._0_8_ = QRect::operator|(&local_48,&local_58);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x14;
      local_48.x2.m_i = extraout_EDX;
      local_48.y2.m_i = extraout_var;
    } while (uVar6 < (ulong)(this->items).d.size);
  }
  QVar4.wd.m_i = (local_48.x2.m_i - local_48.x1.m_i) + 1;
  QVar4.ht.m_i = (local_48.y2.m_i - local_48.y1.m_i) + 1;
  (this->super_QCommonListViewBase).contentsSize = QVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconModeViewBase::updateContentsSize()
{
    QRect bounding;
    for (int i = 0; i < items.size(); ++i)
        bounding |= items.at(i).rect();
    contentsSize = bounding.size();
}